

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O2

void __thiscall flatbuffers::Parser::Parser(Parser *this)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->structs_).dict._M_t._M_impl.super__Rb_tree_header;
  (this->structs_).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->structs_).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->structs_).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->structs_).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->structs_).dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->structs_).vec.
  super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->structs_).vec.
  super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->structs_).vec.
  super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->enums_).dict._M_t._M_impl.super__Rb_tree_header;
  (this->enums_).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->enums_).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->enums_).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->enums_).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->enums_).dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->enums_).vec.
  super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->enums_).vec.
  super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->enums_).vec.
  super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->name_space_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->name_space_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->name_space_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->error_)._M_dataplus._M_p = (pointer)&(this->error_).field_2;
  (this->error_)._M_string_length = 0;
  (this->error_).field_2._M_local_buf[0] = '\0';
  FlatBufferBuilder::FlatBufferBuilder(&this->builder_,0x400);
  this->cursor_ = (char *)0x0;
  this->root_struct_def = (StructDef *)0x0;
  this->source_ = (char *)0x0;
  this->line_ = 1;
  (this->attribute_)._M_dataplus._M_p = (pointer)&(this->attribute_).field_2;
  (this->attribute_)._M_string_length = 0;
  (this->attribute_).field_2._M_local_buf[0] = '\0';
  (this->doc_comment_)._M_dataplus._M_p = (pointer)&(this->doc_comment_).field_2;
  (this->doc_comment_)._M_string_length = 0;
  (this->doc_comment_).field_2._M_local_buf[0] = '\0';
  (this->field_stack_).
  super__Vector_base<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->field_stack_).
  super__Vector_base<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->field_stack_).
  super__Vector_base<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->struct_stack_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->struct_stack_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->struct_stack_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Parser() :
    root_struct_def(nullptr),
    source_(nullptr),
    cursor_(nullptr),
    line_(1) {}